

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall efsw::String::replace(String *this,Iterator i1,Iterator i2,char *s)

{
  __const_iterator local_58;
  __const_iterator local_50;
  undefined1 local_48 [8];
  String tmp;
  char *s_local;
  String *this_local;
  Iterator i2_local;
  Iterator i1_local;
  
  tmp.mString.field_2._8_8_ = s;
  this_local = (String *)i2._M_current;
  i2_local = i1;
  String((String *)local_48,s);
  __gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>::
  __normal_iterator<char32_t*>
            ((__normal_iterator<char32_t_const*,std::__cxx11::u32string> *)&local_50,&i2_local);
  __gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>::
  __normal_iterator<char32_t*>
            ((__normal_iterator<char32_t_const*,std::__cxx11::u32string> *)&local_58,
             (__normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
              *)&this_local);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  replace(&this->mString,local_50,local_58,
          (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)local_48)
  ;
  ~String((String *)local_48);
  return this;
}

Assistant:

String& String::replace( Iterator i1, Iterator i2, const char* s ) {
	String tmp( s );

	mString.replace( i1, i2, tmp.mString );

	return *this;
}